

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

object * __thiscall jessilib::object::operator[](object *this,string_type *in_key)

{
  bool bVar1;
  enable_if_t<is_constructible_v<std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>_&&___exactly_once<std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_&>
  this_00;
  add_pointer_t<std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_> this_01;
  long lVar2;
  add_pointer_t<std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_> map_ptr;
  string_type *in_key_local;
  object *this_local;
  
  bVar1 = null(this);
  if (bVar1) {
    this_00 = std::
              variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              ::
              emplace<std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                        ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                          *)this);
    this_local = std::
                 map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                 ::operator[](this_00,in_key);
  }
  else {
    this_01 = std::
              get_if<std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>,void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                        (&this->m_value);
    if (this_01 ==
        (add_pointer_t<std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>)0x0) {
      lVar2 = __tls_get_addr(&PTR_00311c58);
      if (*(char *)(lVar2 + 0x60) == '\0') {
        lVar2 = __tls_get_addr(&PTR_00311c58);
        __cxa_thread_atexit(~object,lVar2 + 0x20,&__dso_handle);
        lVar2 = __tls_get_addr(&PTR_00311c58);
        *(undefined1 *)(lVar2 + 0x60) = 1;
      }
      lVar2 = __tls_get_addr(&PTR_00311c58);
      std::
      variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
      ::emplace<void*>((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                        *)(lVar2 + 0x20));
      lVar2 = __tls_get_addr(&PTR_00311c58);
      this_local = (object *)(lVar2 + 0x20);
    }
    else {
      this_local = std::
                   map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                   ::operator[](this_01,in_key);
    }
  }
  return this_local;
}

Assistant:

object& object::operator[](const string_type& in_key) {
	if (null()) {
		return m_value.emplace<map_type>()[in_key];
	}

	auto map_ptr = std::get_if<map_type>(&m_value);
	if (map_ptr != nullptr) {
		return map_ptr->operator[](in_key);
	}

	static thread_local object s_null_object;
	s_null_object.m_value.emplace<null_variant_t>();
	return s_null_object;
}